

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdir.cpp
# Opt level: O3

QString * __thiscall QDir::absolutePath(QString *__return_storage_ptr__,QDir *this)

{
  QDirPrivate *this_00;
  QAbstractFileEngine *pQVar1;
  
  this_00 = (this->d_ptr).d.ptr;
  pQVar1 = (this_00->fileEngine)._M_t.
           super___uniq_ptr_impl<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_>.
           _M_t.
           super__Tuple_impl<0UL,_QAbstractFileEngine_*,_std::default_delete<QAbstractFileEngine>_>.
           super__Head_base<0UL,_QAbstractFileEngine_*,_false>._M_head_impl;
  if (pQVar1 == (QAbstractFileEngine *)0x0) {
    QDirPrivate::resolveAbsoluteEntry(__return_storage_ptr__,this_00);
  }
  else {
    (*pQVar1->_vptr_QAbstractFileEngine[0x19])(__return_storage_ptr__,pQVar1,3);
  }
  return __return_storage_ptr__;
}

Assistant:

QString QDir::absolutePath() const
{
    Q_D(const QDir);
    if (!d->fileEngine)
        return d->resolveAbsoluteEntry();

    return d->fileEngine->fileName(QAbstractFileEngine::AbsoluteName);
}